

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

ByteData *
cfd::core::Psbt::CreateRecordKey
          (ByteData *__return_storage_ptr__,uint8_t type,string *prefix,uint8_t sub_type,
          string *sub_key)

{
  uint8_t *puVar1;
  size_t sVar2;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_58;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  puVar1 = (uint8_t *)(prefix->_M_dataplus)._M_p;
  sVar2 = strlen((char *)puVar1);
  ByteData::ByteData((ByteData *)&local_40,puVar1,(uint32_t)sVar2);
  puVar1 = (uint8_t *)(sub_key->_M_dataplus)._M_p;
  sVar2 = strlen((char *)puVar1);
  ByteData::ByteData((ByteData *)&_Stack_58,puVar1,(uint32_t)sVar2);
  CreateRecordKey(__return_storage_ptr__,type,(ByteData *)&local_40,sub_type,(ByteData *)&_Stack_58)
  ;
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_58);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  return __return_storage_ptr__;
}

Assistant:

ByteData Psbt::CreateRecordKey(
    uint8_t type, const std::string &prefix, uint8_t sub_type,
    const std::string &sub_key) {
  return CreateRecordKey(
      type,
      ByteData(
          reinterpret_cast<const uint8_t *>(prefix.data()),
          static_cast<uint32_t>(strlen(prefix.c_str()))),
      sub_type,
      ByteData(
          reinterpret_cast<const uint8_t *>(sub_key.data()),
          static_cast<uint32_t>(strlen(sub_key.c_str()))));
}